

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

void __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
::reset(ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
        *this,size_t newBlockSize)

{
  pointer ppNVar1;
  size_t sVar2;
  pointer ppNVar3;
  
  ppNVar3 = (this->allocations).
            super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (this->allocations).
            super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar3 != ppNVar1) {
    do {
      operator_delete(*ppNVar3,this->blockSize * 0x48);
      ppNVar3 = ppNVar3 + 1;
    } while (ppNVar3 != ppNVar1);
    ppNVar3 = (this->allocations).
              super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->allocations).
        super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppNVar3) {
      (this->allocations).
      super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
    }
  }
  sVar2 = newBlockSize + (newBlockSize == 0);
  this->blockSize = sVar2;
  this->currentBlock = (Node *)0x0;
  this->currentIndex = sVar2;
  return;
}

Assistant:

void reset(std::size_t newBlockSize) {
            for (auto allocation : allocations) {
                alloc_traits::deallocate(alloc, allocation, blockSize);
            }
            allocations.clear();
            blockSize = std::max<std::size_t>(1, newBlockSize);
            currentBlock = nullptr;
            currentIndex = blockSize;
        }